

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  string *psVar4;
  FileDescriptor *pFVar5;
  size_type sVar6;
  ulong uVar7;
  Tables *in_RDI;
  DescriptorBuilder *unaff_retaddr;
  Tables *in_stack_00000030;
  FileDescriptor *result;
  int i_1;
  int i;
  FileDescriptor *existing_file;
  string *in_stack_000000b0;
  DescriptorPool *in_stack_000000b8;
  FileDescriptorProto *in_stack_000000c8;
  FileDescriptor *in_stack_000000d0;
  FileDescriptorProto *in_stack_000004a0;
  DescriptorBuilder *in_stack_000004a8;
  int in_stack_ffffffffffffff8c;
  FileDescriptorTables *in_stack_ffffffffffffff90;
  value_type *in_stack_ffffffffffffff98;
  Tables *in_stack_ffffffffffffffa0;
  Tables *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Tables *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffd0;
  int iVar8;
  int iVar9;
  int iVar10;
  Tables *this_01;
  FileDescriptorProto *in_stack_fffffffffffffff8;
  
  this_01 = in_RDI;
  psVar4 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4ae882);
  std::__cxx11::string::operator=
            ((string *)&(in_RDI->known_bad_files_)._M_h._M_rehash_policy,(string *)psVar4);
  pFVar5 = DescriptorPool::Tables::FindFile(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((pFVar5 == (FileDescriptor *)0x0) ||
     (bVar1 = ExistingFileMatchesProto(in_stack_000000d0,in_stack_000000c8), !bVar1)) {
    for (iVar10 = 0; uVar7 = (ulong)iVar10,
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI->pending_files_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish), uVar7 < sVar6;
        iVar10 = iVar10 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI->pending_files_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(long)iVar10);
      FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4ae927);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffffb0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (_Var2) {
        AddRecursiveImportError
                  (unaff_retaddr,in_stack_fffffffffffffff8,(int)((ulong)this_01 >> 0x20));
        return (FileDescriptor *)0x0;
      }
    }
    if ((((in_RDI->pending_files_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length & 0x100) == 0) &&
       (((in_RDI->pending_files_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0)) {
      in_stack_ffffffffffffffb0 =
           (Tables *)
           (in_RDI->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4ae9aa);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&in_stack_ffffffffffffffa0->pending_files_,in_stack_ffffffffffffff98);
      iVar8 = 0;
      while (iVar9 = iVar8,
            iVar3 = FileDescriptorProto::dependency_size((FileDescriptorProto *)0x4ae9d1),
            iVar8 < iVar3) {
        this_00 = (Tables *)
                  (in_RDI->pending_files_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        FileDescriptorProto::dependency_abi_cxx11_
                  ((FileDescriptorProto *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        pFVar5 = DescriptorPool::Tables::FindFile(this_00,in_stack_ffffffffffffff98);
        if (pFVar5 == (FileDescriptor *)0x0) {
          if (*(long *)((long)&((in_RDI->pending_files_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8) != 0) {
            in_stack_ffffffffffffff98 =
                 *(value_type **)
                  ((long)&((in_RDI->pending_files_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_2 + 8);
            FileDescriptorProto::dependency_abi_cxx11_
                      ((FileDescriptorProto *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
            pFVar5 = DescriptorPool::FindFileByName
                               ((DescriptorPool *)CONCAT44(iVar10,iVar9),in_stack_ffffffffffffffd0);
            if (pFVar5 != (FileDescriptor *)0x0) goto LAB_004aea77;
          }
          in_stack_ffffffffffffff90 =
               (FileDescriptorTables *)
               (in_RDI->pending_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          FileDescriptorProto::dependency_abi_cxx11_
                    ((FileDescriptorProto *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          DescriptorPool::TryFindFileInFallbackDatabase(in_stack_000000b8,in_stack_000000b0);
        }
LAB_004aea77:
        iVar8 = iVar9 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x4aea97);
    }
    DescriptorPool::Tables::AddCheckpoint(in_stack_ffffffffffffffb0);
    pFVar5 = BuildFileImpl(in_stack_000004a8,in_stack_000004a0);
    FileDescriptorTables::FinalizeTables(in_stack_ffffffffffffff90);
    if (pFVar5 == (FileDescriptor *)0x0) {
      DescriptorPool::Tables::RollbackToLastCheckpoint(in_stack_00000030);
    }
    else {
      DescriptorPool::Tables::ClearLastCheckpoint(this_01);
      pFVar5[0x41] = (FileDescriptor)0x1;
    }
  }
  return pFVar5;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}